

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O3

bool TestEigen(Matrix *m,initializer_list<EigenAnswer> c,double eps)

{
  long lVar1;
  iterator v;
  EigenAnswer *now;
  double dVar2;
  double dVar3;
  
  v = c._M_array;
  if (c._M_len == 0) {
    dVar3 = 0.0;
  }
  else {
    lVar1 = c._M_len << 5;
    dVar3 = 0.0;
    do {
      dVar2 = Utils::EigValueNorm(m,&v->vector,v->value);
      dVar3 = dVar3 + dVar2;
      v = v + 1;
      lVar1 = lVar1 + -0x20;
    } while (lVar1 != 0);
  }
  return dVar3 < eps;
}

Assistant:

bool TestEigen(const Matrix &m, std::initializer_list<EigenAnswer> c, double eps)
{
    double currentError = 0;

    for (const auto &now: c)
    {
        currentError += Utils::EigValueNorm(m, now.vector, now.value);
    }

    return eps > currentError;
}